

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<long_double>::~TPZBlockDiagonal(TPZBlockDiagonal<long_double> *this)

{
  ~TPZBlockDiagonal(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}